

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

FileTypeEnum
cmsys::SystemTools::DetectFileType(char *filename,unsigned_long length,double percent_bin)

{
  unsigned_long uVar1;
  bool bVar2;
  FILE *pFVar3;
  uchar *__ptr;
  size_t sVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double current_percent_bin;
  uchar *buffer_end;
  uchar *ptr;
  size_t text_count;
  size_t read_length;
  uchar *buffer;
  string local_88;
  FILE *local_68;
  FILE *fp;
  allocator local_49;
  string local_48;
  double local_28;
  double percent_bin_local;
  unsigned_long length_local;
  char *filename_local;
  
  if ((filename == (char *)0x0) || (percent_bin < 0.0)) {
    filename_local._4_4_ = FileTypeUnknown;
  }
  else {
    local_28 = percent_bin;
    percent_bin_local = (double)length;
    length_local = (unsigned_long)filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,filename,&local_49);
    bVar2 = FileIsDirectory(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    uVar1 = length_local;
    if (bVar2) {
      filename_local._4_4_ = FileTypeUnknown;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,(char *)uVar1,(allocator *)((long)&buffer + 7));
      pFVar3 = (FILE *)Fopen(&local_88,"rb");
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&buffer + 7));
      if (pFVar3 == (FILE *)0x0) {
        filename_local._4_4_ = FileTypeUnknown;
      }
      else {
        local_68 = pFVar3;
        __ptr = (uchar *)operator_new__((ulong)percent_bin_local);
        sVar4 = fread(__ptr,1,(size_t)percent_bin_local,local_68);
        fclose(local_68);
        if (sVar4 == 0) {
          if (__ptr != (uchar *)0x0) {
            operator_delete__(__ptr);
          }
          filename_local._4_4_ = FileTypeUnknown;
        }
        else {
          ptr = (uchar *)0x0;
          for (buffer_end = __ptr; buffer_end != __ptr + sVar4; buffer_end = buffer_end + 1) {
            if ((((0x1f < *buffer_end) && (*buffer_end < 0x80)) || (*buffer_end == '\n')) ||
               ((*buffer_end == '\r' || (*buffer_end == '\t')))) {
              ptr = ptr + 1;
            }
          }
          if (__ptr != (uchar *)0x0) {
            operator_delete__(__ptr);
          }
          lVar5 = sVar4 - (long)ptr;
          auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar6._0_8_ = lVar5;
          auVar6._12_4_ = 0x45300000;
          auVar7._8_4_ = (int)(sVar4 >> 0x20);
          auVar7._0_8_ = sVar4;
          auVar7._12_4_ = 0x45300000;
          if (((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
              ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) < local_28) {
            filename_local._4_4_ = FileTypeText;
          }
          else {
            filename_local._4_4_ = FileTypeBinary;
          }
        }
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

SystemTools::FileTypeEnum
SystemTools::DetectFileType(const char *filename,
                            unsigned long length,
                            double percent_bin)
{
  if (!filename || percent_bin < 0)
    {
    return SystemTools::FileTypeUnknown;
    }

  if (SystemTools::FileIsDirectory(filename))
    {
    return SystemTools::FileTypeUnknown;
    }

  FILE *fp = Fopen(filename, "rb");
  if (!fp)
    {
    return SystemTools::FileTypeUnknown;
    }

  // Allocate buffer and read bytes

  unsigned char *buffer = new unsigned char [length];
  size_t read_length = fread(buffer, 1, length, fp);
  fclose(fp);
  if (read_length == 0)
    {
    delete [] buffer;
    return SystemTools::FileTypeUnknown;
    }

  // Loop over contents and count

  size_t text_count = 0;

  const unsigned char *ptr = buffer;
  const unsigned char *buffer_end = buffer + read_length;

  while (ptr != buffer_end)
    {
    if ((*ptr >= 0x20 && *ptr <= 0x7F) ||
        *ptr == '\n' ||
        *ptr == '\r' ||
        *ptr == '\t')
      {
      text_count++;
      }
    ptr++;
    }

  delete [] buffer;

  double current_percent_bin =
    (static_cast<double>(read_length - text_count) /
     static_cast<double>(read_length));

  if (current_percent_bin >= percent_bin)
    {
    return SystemTools::FileTypeBinary;
    }

  return SystemTools::FileTypeText;
}